

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

deUint32 __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::getIterationSeed
          (TextureBorderClampTest *this,IterationConfig *config)

{
  int iVar1;
  deUint32 dVar2;
  char *__s;
  SeedBuilder *pSVar3;
  Texture2D *pTVar4;
  Texture2D *pTVar5;
  allocator<char> local_41;
  string local_40;
  SeedBuilder local_1c;
  IterationConfig *pIStack_18;
  SeedBuilder builder;
  IterationConfig *config_local;
  TextureBorderClampTest *this_local;
  
  pIStack_18 = config;
  tcu::SeedBuilder::SeedBuilder(&local_1c);
  __s = tcu::TestNode::getName((TestNode *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  pSVar3 = tcu::operator<<(&local_1c,&local_40);
  pSVar3 = tcu::operator<<(pSVar3,this->m_iterationNdx);
  pSVar3 = tcu::operator<<(pSVar3,this->m_texFormat);
  pSVar3 = tcu::operator<<(pSVar3,pIStack_18->minFilter);
  pSVar3 = tcu::operator<<(pSVar3,pIStack_18->magFilter);
  pTVar4 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
  pTVar5 = glu::Texture2D::getRefTexture(pTVar4);
  iVar1 = tcu::Texture2D::getWidth(pTVar5);
  pSVar3 = tcu::operator<<(pSVar3,iVar1);
  pTVar4 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
  pTVar5 = glu::Texture2D::getRefTexture(pTVar4);
  iVar1 = tcu::Texture2D::getHeight(pTVar5);
  tcu::operator<<(pSVar3,iVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  dVar2 = tcu::SeedBuilder::get(&local_1c);
  return dVar2;
}

Assistant:

deUint32 TextureBorderClampTest::getIterationSeed (const IterationConfig& config) const
{
	tcu::SeedBuilder builder;
	builder	<< std::string(getName())
			<< m_iterationNdx
			<< m_texFormat
			<< config.minFilter << config.magFilter
			<< m_texture->getRefTexture().getWidth() << m_texture->getRefTexture().getHeight();
	return builder.get();
}